

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  pid_t pVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  bool local_2a2;
  bool local_2a1;
  gid_t local_29c;
  int rc2;
  gid_t gid;
  uid_t uid;
  mode_t openMode;
  UnixUnusedFd *pUnused;
  char *zName;
  int isNewJrnl;
  int isReadWrite;
  int isReadonly;
  int isCreate;
  int isDelete;
  int isExclusive;
  int ctrlFlags;
  int rc;
  int noLock;
  int eType;
  int openFlags;
  int fd;
  unixFile *p;
  int *pOutFlags_local;
  sqlite3_file *psStack_238;
  int flags_local;
  sqlite3_file *pFile_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  undefined1 local_218 [8];
  char zTmpname [514];
  
  pVar1 = randomnessPid;
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  eType = -1;
  noLock = 0;
  rc = flags & 0xfff00;
  isExclusive = 0;
  isDelete = 0;
  isCreate = flags & 0x10;
  isReadonly = flags & 8;
  isReadWrite = flags & 4;
  isNewJrnl = flags & 1;
  zName._4_4_ = flags & 2;
  local_2a1 = false;
  if (isReadWrite != 0) {
    local_2a2 = true;
    if ((rc != 0x4000) && (local_2a2 = true, rc != 0x800)) {
      local_2a2 = rc == 0x80000;
    }
    local_2a1 = local_2a2;
  }
  zName._0_4_ = (uint)local_2a1;
  pUnused = (UnixUnusedFd *)zPath;
  _openFlags = pFile;
  p = (unixFile *)pOutFlags;
  pOutFlags_local._4_4_ = flags;
  psStack_238 = pFile;
  pFile_local = (sqlite3_file *)zPath;
  zPath_local = (char *)pVfs;
  _Var2 = getpid();
  if (pVar1 != _Var2) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  memset(_openFlags,0,0x78);
  if (rc == 0x100) {
    _uid = (sqlite3_io_methods *)findReusableFd((char *)pUnused,pOutFlags_local._4_4_);
    if (_uid == (sqlite3_io_methods *)0x0) {
      _uid = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
      if (_uid == (sqlite3_io_methods *)0x0) {
        pVfs_local._4_4_ = 7;
        goto LAB_001238be;
      }
    }
    else {
      eType = _uid->iVersion;
    }
    _openFlags[6].pMethods = _uid;
  }
  else if (pUnused == (UnixUnusedFd *)0x0) {
    isExclusive = unixGetTempname(*(int *)(zPath_local + 8),local_218);
    pVfs_local._4_4_ = isExclusive;
    if (isExclusive != 0) goto LAB_001238be;
    pUnused = (UnixUnusedFd *)local_218;
    isExclusive = 0;
  }
  if (zName._4_4_ != 0) {
    noLock = noLock | 2;
  }
  if (isReadWrite != 0) {
    noLock = noLock | 0x40;
  }
  if (isCreate != 0) {
    noLock = noLock | 0x20080;
  }
  noLock = noLock | 0x20000;
  if (eType < 0) {
    isExclusive = findCreateFileMode((char *)pUnused,pOutFlags_local._4_4_,&gid,(uid_t *)&rc2,
                                     &local_29c);
    pVfs_local._4_4_ = isExclusive;
    if (isExclusive != 0) goto LAB_001238be;
    eType = robust_open((char *)pUnused,noLock,gid);
    if (eType < 0) {
      if ((((uint)zName == 0) || (piVar4 = __errno_location(), *piVar4 != 0xd)) ||
         (iVar3 = (*aSyscall[2].pCurrent)(pUnused,0), iVar3 == 0)) {
        piVar4 = __errno_location();
        if ((*piVar4 != 0x15) && (zName._4_4_ != 0)) {
          noLock = noLock & 0xffffffbd;
          pOutFlags_local._4_4_ = pOutFlags_local._4_4_ & 0xfffffff9 | 1;
          isNewJrnl = 1;
          eType = robust_open((char *)pUnused,noLock,gid);
        }
      }
      else {
        isExclusive = 0x608;
      }
    }
    if (-1 < eType) {
      if ((gid != 0) && ((pOutFlags_local._4_4_ & 0x80800) != 0)) {
        robustFchown(eType,rc2,local_29c);
      }
      goto LAB_0012376b;
    }
    iVar3 = sqlite3CantopenError(0xa2f2);
    iVar3 = unixLogErrorAtLine(iVar3,"open",(char *)pUnused,0xa2f2);
    if (isExclusive == 0) {
      isExclusive = iVar3;
    }
  }
  else {
LAB_0012376b:
    if (p != (unixFile *)0x0) {
      *(uint *)&p->pMethod = pOutFlags_local._4_4_;
    }
    if (_openFlags[6].pMethods != (sqlite3_io_methods *)0x0) {
      (_openFlags[6].pMethods)->iVersion = eType;
      *(uint *)&(_openFlags[6].pMethods)->field_0x4 = pOutFlags_local._4_4_ & 3;
    }
    if (isReadonly != 0) {
      (*aSyscall[0x10].pCurrent)(pUnused);
    }
    if (isReadonly != 0) {
      isDelete = isDelete | 0x20;
    }
    if (isNewJrnl != 0) {
      isDelete = isDelete | 2;
    }
    ctrlFlags = (int)(rc != 0x100);
    if (ctrlFlags != 0) {
      isDelete = isDelete | 0x80;
    }
    if ((uint)zName != 0) {
      isDelete = isDelete | 8;
    }
    if ((pOutFlags_local._4_4_ & 0x40) != 0) {
      isDelete = isDelete | 0x40;
    }
    isExclusive = fillInUnixFile((sqlite3_vfs *)zPath_local,eType,psStack_238,(char *)pFile_local,
                                 isDelete);
  }
  if (isExclusive != 0) {
    sqlite3_free(_openFlags[6].pMethods);
  }
  pVfs_local._4_4_ = isExclusive;
LAB_001238be:
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return pVfs_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}